

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  bool *v1;
  bool *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  Extension *local_50;
  bool local_39;
  LogMessage local_30;
  Voidify local_1b;
  bool local_1a;
  bool local_19;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *this_local;
  
  local_19 = (bool)(this->field_0xa & 1);
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_19);
  local_39 = true;
  if ((this->is_repeated & 1U) == 0) {
    local_39 = FieldTypeIsPointer(this->type);
  }
  local_1a = local_39;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_1a);
  local_18 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_pointer == is_repeated || FieldTypeIsPointer(type)");
  if (local_18 == (Nullable<const_char_*>)0x0) {
    local_50 = this;
    if ((this->field_0xa & 1) != 0) {
      local_50 = (Extension *)
                 absl::lts_20250127::
                 bit_cast<const_void_*,_google::protobuf::internal::ExtensionSet::Extension::Pointer,_0>
                           ((Pointer *)this);
    }
    return local_50;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.h"
             ,0x2d7,failure_msg);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }